

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O2

error_code mio::detail::last_error(void)

{
  uint uVar1;
  uint *puVar2;
  error_category *peVar3;
  error_code eVar4;
  
  puVar2 = (uint *)__errno_location();
  uVar1 = *puVar2;
  peVar3 = (error_category *)std::_V2::system_category();
  eVar4._4_4_ = 0;
  eVar4._M_value = uVar1;
  eVar4._M_cat = peVar3;
  return eVar4;
}

Assistant:

inline std::error_code last_error() noexcept
{
    std::error_code error;
#ifdef _WIN32
    error.assign(GetLastError(), std::system_category());
#else
    error.assign(errno, std::system_category());
#endif
    return error;
}